

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

int __thiscall miniros::RPCManager::bind(RPCManager *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  XMLRPCCallWrapper *this_00;
  mapped_type *this_01;
  undefined4 in_register_00000034;
  key_type *__k;
  FunctionInfo info;
  
  __k = (key_type *)CONCAT44(in_register_00000034,__fd);
  std::mutex::lock(&this->functions_mutex_);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
          ::find(&(this->functions_)._M_t,__k);
  p_Var1 = &(this->functions_)._M_t._M_impl.super__Rb_tree_header;
  this_00 = (XMLRPCCallWrapper *)__addr;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
    info.name._M_string_length = 0;
    info.name.field_2._M_local_buf[0] = '\0';
    info.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    info.function.super__Function_base._M_functor._8_8_ = 0;
    info.function.super__Function_base._M_manager = (_Manager_type)0x0;
    info.function._M_invoker = (_Invoker_type)0x0;
    info.functionEx.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    info.functionEx.super__Function_base._M_functor._8_8_ = 0;
    info.functionEx.super__Function_base._M_manager = (_Manager_type)0x0;
    info.functionEx._M_invoker = (_Invoker_type)0x0;
    info.object = (void *)0x0;
    info.wrapper.super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    info.wrapper.super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::_M_assign((string *)&info);
    std::function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>::operator=
              (&info.function,
               (function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)__addr);
    this_00 = (XMLRPCCallWrapper *)operator_new(0x50);
    XMLRPCCallWrapper::XMLRPCCallWrapper(this_00,__k,(XMLRPCFunc *)__addr,&this->server_);
    std::__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>::
    reset<miniros::XMLRPCCallWrapper>
              (&info.wrapper.
                super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>,this_00);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
              ::operator[](&this->functions_,__k);
    FunctionInfo::operator=(this_01,&info);
    FunctionInfo::~FunctionInfo(&info);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
  return (int)CONCAT71((int7)((ulong)this_00 >> 8),(_Rb_tree_header *)iVar2._M_node == p_Var1);
}

Assistant:

bool RPCManager::bind(const std::string& function_name, const XMLRPCFunc& cb)
{
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  if (functions_.find(function_name) != functions_.end())
  {
    return false;
  }

  FunctionInfo info;
  info.name = function_name;
  info.function = cb;
  info.wrapper.reset(new XMLRPCCallWrapper(function_name, cb, &server_));
  functions_[function_name] = info;

  return true;
}